

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O0

void ImGui::Indicator(bool bOK,char *okText,char *nokText)

{
  bool bVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  byte in_DIL;
  char *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  char *text;
  
  GetContentRegionMax();
  GetWidthIconBtn(SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x18,0));
  SetCursorPosX((float)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  if ((in_DIL & 1) == 0) {
    text = anon_var_dwarf_16ba9c;
  }
  else {
    text = anon_var_dwarf_16ba91;
  }
  TextUnformatted(text,in_stack_ffffffffffffffc8);
  bVar1 = IsItemHovered((ImGuiHoveredFlags)text);
  if (bVar1) {
    if ((in_DIL & 1) != 0) {
      in_RDX = in_RSI;
    }
    SetTooltip("%s",in_RDX);
  }
  return;
}

Assistant:

IMGUI_API void Indicator (bool bOK, const char* okText, const char* nokText)
{
    // right-aligned
    ImGui::SetCursorPosX(ImGui::GetContentRegionMax().x - ImGui::GetWidthIconBtn());
    // for the active line decide based on temporary check
    ImGui::TextUnformatted(bOK ? ICON_FA_CHECK_CIRCLE : ICON_FA_EXCLAMATION_TRIANGLE);
    if (ImGui::IsItemHovered())
        ImGui::SetTooltip("%s", bOK ? okText : nokText);
}